

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  int iVar1;
  cpp *pcVar2;
  cpp *pcVar3;
  bool bVar4;
  EnumDescriptor *pEVar5;
  undefined1 deprecated;
  long lVar6;
  int number;
  EnumValueDescriptor *enum_value;
  EnumValueDescriptor *enum_value_00;
  EnumValueDescriptor *enum_value_01;
  long lVar7;
  cpp *pcVar8;
  char *pcVar9;
  cpp *this_00;
  Formatter format;
  Formatter format_value;
  allocator local_f9;
  cpp *local_f8;
  long local_f0;
  string local_e8;
  Formatter local_c8;
  long local_90;
  string local_88;
  Formatter local_68;
  
  local_c8.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_c8.vars_._M_t,&(this->variables_)._M_t);
  Formatter::operator()(&local_c8,"enum ${1$$classname$$}$ : int {\n",&this->descriptor_);
  io::Printer::Indent(local_c8.printer_);
  pEVar5 = this->descriptor_;
  this_00 = *(cpp **)(pEVar5 + 0x30);
  lVar7 = 0;
  local_90 = 0;
  local_f8 = this_00;
  while( true ) {
    lVar6 = (long)*(int *)(pEVar5 + 0x2c);
    if (lVar6 <= local_90) break;
    Formatter::Formatter(&local_68,&local_c8);
    deprecated = (undefined1)lVar6;
    std::__cxx11::string::string((string *)&local_e8,"name",&local_f9);
    EnumValueName_abi_cxx11_
              (&local_88,(cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar7),enum_value);
    Formatter::Set<std::__cxx11::string>(&local_68,&local_e8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_e8,"number",&local_f9);
    Int32ToString_abi_cxx11_
              (&local_88,(cpp *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar7)
               ,number);
    Formatter::Set<std::__cxx11::string>(&local_68,&local_e8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::string((string *)&local_e8,"deprecation",&local_f9);
    DeprecatedAttribute_abi_cxx11_
              (&local_88,(cpp *)this->options_,
               (Options *)
               (ulong)*(byte *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0x20 + lVar7) + 0x48
                               ),(bool)deprecated);
    Formatter::Set<std::__cxx11::string>(&local_68,&local_e8,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_e8);
    local_f0 = lVar7;
    if (lVar7 != 0) {
      Formatter::operator()<>(&local_68,",\n");
    }
    lVar7 = local_f0;
    pcVar2 = local_f8;
    local_e8._M_dataplus._M_p = (pointer)(*(long *)(this->descriptor_ + 0x30) + local_f0);
    Formatter::operator()
              (&local_68,"${1$$prefix$$name$$}$ $deprecation$= $number$",
               (EnumValueDescriptor **)&local_e8);
    iVar1 = *(int *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar7);
    pcVar8 = (cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar7);
    pcVar3 = pcVar8;
    if (*(int *)(this_00 + 0x10) <= iVar1) {
      pcVar3 = this_00;
    }
    this_00 = pcVar3;
    if (iVar1 <= *(int *)(pcVar2 + 0x10)) {
      pcVar8 = pcVar2;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_68.vars_._M_t);
    local_90 = local_90 + 1;
    pEVar5 = this->descriptor_;
    lVar7 = local_f0 + 0x28;
    local_f8 = pcVar8;
  }
  if (*(int *)(*(long *)(pEVar5 + 0x10) + 0x3c) == 3) {
    if (0 < *(int *)(pEVar5 + 0x2c)) {
      Formatter::operator()<>(&local_c8,",\n");
    }
    Formatter::operator()<>
              (&local_c8,
               "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::min(),\n$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::max()"
              );
  }
  io::Printer::Outdent(local_c8.printer_);
  Formatter::operator()<>(&local_c8,"\n};\n");
  EnumValueName_abi_cxx11_((string *)&local_68,this_00,enum_value_00);
  EnumValueName_abi_cxx11_(&local_e8,local_f8,enum_value_01);
  Formatter::operator()
            (&local_c8,
             "$dllexport_decl $bool $classname$_IsValid(int value);\nconstexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = $prefix$$2$;\nconstexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = $prefix$$3$;\n"
             ,&this->descriptor_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
             &local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  if (this->generate_array_size_ == true) {
    Formatter::operator()
              (&local_c8,
               "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = $prefix$$short_name$_MAX + 1;\n\n"
               ,&this->descriptor_);
  }
  bVar4 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  if (bVar4) {
    Formatter::operator()<>
              (&local_c8,
               "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* $classname$_descriptor();\n");
  }
  bVar4 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  if (!bVar4) {
    Formatter::operator()<>(&local_c8,"const std::string& $classname$_Name($classname$ value);\n");
  }
  Formatter::operator()<>
            (&local_c8,
             "template<typename T>\ninline const std::string& $classname$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $classname$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $classname$_Name.\");\n"
            );
  bVar4 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  pcVar9 = "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n";
  if (bVar4) {
    pcVar9 = 
    "  return ::$proto_ns$::internal::NameOfEnum(\n    $classname$_descriptor(), enum_t_value);\n";
  }
  Formatter::operator()<>(&local_c8,pcVar9);
  Formatter::operator()<>(&local_c8,"}\n");
  bVar4 = HasDescriptorMethods(*(FileDescriptor **)(this->descriptor_ + 0x10),this->options_);
  pcVar9 = "bool $classname$_Parse(\n    const std::string& name, $classname$* value);\n";
  if (bVar4) {
    pcVar9 = 
    "inline bool $classname$_Parse(\n    const std::string& name, $classname$* value) {\n  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n    $classname$_descriptor(), name, value);\n}\n"
    ;
  }
  Formatter::operator()<>(&local_c8,pcVar9);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8.vars_._M_t);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("enum ${1$$classname$$}$ : int {\n", descriptor_);
  format.Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    auto format_value = format;
    format_value.Set("name", EnumValueName(descriptor_->value(i)));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    format_value.Set("number", Int32ToString(descriptor_->value(i)->number()));
    format_value.Set(
        "deprecation",
        DeprecatedAttribute(options_,
                            descriptor_->value(i)->options().deprecated()));

    if (i > 0) format_value(",\n");
    format_value("${1$$prefix$$name$$}$ $deprecation$= $number$",
                 descriptor_->value(i));

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) format(",\n");
    format(
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::min(),\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::max()");
  }

  format.Outdent();
  format("\n};\n");

  format(
      "$dllexport_decl $bool $classname$_IsValid(int value);\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = "
      "$prefix$$2$;\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = "
      "$prefix$$3$;\n",
      descriptor_, EnumValueName(min_value), EnumValueName(max_value));

  if (generate_array_size_) {
    format(
        "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = "
        "$prefix$$short_name$_MAX + 1;\n\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* "
        "$classname$_descriptor();\n");
  }

  // The _Name and _Parse functions. The lite implementation is table-based, so
  // we make sure to keep the tables hidden in the .cc file.
  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    format("const std::string& $classname$_Name($classname$ value);\n");
  }
  // The _Name() function accepts the enum type itself but also any integral
  // type.
  format(
      "template<typename T>\n"
      "inline const std::string& $classname$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $classname$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $classname$_Name.\");\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "  return ::$proto_ns$::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), enum_t_value);\n");
  } else {
    format(
        "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  format("}\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "inline bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value) {\n"
        "  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n"
        "    $classname$_descriptor(), name, value);\n"
        "}\n");
  } else {
    format(
        "bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value);\n");
  }
}